

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_stub.c
# Opt level: O3

int ld_nation(code_t *cp,int mode)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ld_nation::count + 1;
  bVar2 = ld_nation::count == 0;
  ld_nation::count = iVar1;
  if (bVar2) {
    printf("%s %s\n","No load routine has been defined","for the nation table");
  }
  return 0;
}

Assistant:

int 
ld_nation (code_t *cp, int mode)
{
    static int count = 0;
	UNUSED(cp);
	UNUSED(mode);

    if (! count++)
        printf("%s %s\n",
            "No load routine has been defined",
            "for the nation table");

    return(0);
}